

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

bool re2::PCRE::Replace(string *str,PCRE *pattern,StringPiece *rewrite)

{
  StringPiece *rewrite_00;
  bool bVar1;
  StringPiece local_140;
  string local_130 [8];
  string s;
  StringPiece local_110;
  int local_fc;
  int local_f8;
  int matches;
  int vec [51];
  StringPiece *rewrite_local;
  PCRE *pattern_local;
  string *str_local;
  
  unique0x10000165 = rewrite;
  memset(&local_f8,0,0xcc);
  StringPiece::StringPiece(&local_110,str);
  local_fc = TryMatch(pattern,&local_110,0,UNANCHORED,true,&local_f8,0x33);
  if (local_fc == 0) {
    str_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::string(local_130);
    rewrite_00 = stack0xffffffffffffffd8;
    StringPiece::StringPiece(&local_140,str);
    bVar1 = Rewrite(pattern,(string *)local_130,rewrite_00,&local_140,&local_f8,local_fc);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_f8 < 0) {
        __assert_fail("vec[0] >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                      ,0x177,
                      "static bool re2::PCRE::Replace(string *, const PCRE &, const StringPiece &)")
        ;
      }
      if (matches < 0) {
        __assert_fail("vec[1] >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                      ,0x178,
                      "static bool re2::PCRE::Replace(string *, const PCRE &, const StringPiece &)")
        ;
      }
      std::__cxx11::string::replace((ulong)str,(long)local_f8,(string *)(long)(matches - local_f8));
      str_local._7_1_ = true;
    }
    else {
      str_local._7_1_ = false;
    }
    std::__cxx11::string::~string(local_130);
  }
  return str_local._7_1_;
}

Assistant:

bool PCRE::Replace(string *str,
                 const PCRE& pattern,
                 const StringPiece& rewrite) {
  int vec[kVecSize] = {};
  int matches = pattern.TryMatch(*str, 0, UNANCHORED, true, vec, kVecSize);
  if (matches == 0)
    return false;

  string s;
  if (!pattern.Rewrite(&s, rewrite, *str, vec, matches))
    return false;

  assert(vec[0] >= 0);
  assert(vec[1] >= 0);
  str->replace(vec[0], vec[1] - vec[0], s);
  return true;
}